

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

MIR_op_mode_t MIR_insn_op_mode(MIR_context_t ctx,MIR_insn_t_conflict insn,size_t nop,int *out_p)

{
  byte bVar1;
  MIR_label_t pMVar2;
  VARR_MIR_proto_t *pVVar3;
  MIR_proto_t pMVar4;
  VARR_MIR_var_t *varr;
  long *plVar5;
  ulong *puVar6;
  MIR_insn_t pMVar7;
  uint uVar8;
  int iVar9;
  MIR_proto_t *ppMVar10;
  void *__ptr;
  undefined8 *extraout_RDX;
  size_t sVar11;
  ulong uVar12;
  ulong unaff_RBP;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 *unaff_R14;
  MIR_proto_t *ppMStack_80;
  int aiStack_78 [2];
  reg_desc_t rStack_70;
  MIR_var_t local_28;
  
  uVar13 = *(ulong *)&insn->field_0x18;
  *out_p = 0;
  uVar14 = uVar13 >> 0x20;
  if (uVar14 <= nop) {
    return MIR_OP_BOUND;
  }
  iVar9 = (int)uVar13;
  if (iVar9 < 0xaa) {
    if (3 < iVar9 - 0x1eU) {
      if (iVar9 - 0xa7U < 2) {
        if ((insn->ops[0].field_0x8 != '\b') ||
           (pMVar2 = insn->ops[0].u.label, *(int *)&pMVar2->ops[0].data != 1)) {
          __assert_fail("proto_op.mode == MIR_OP_REF && proto_op.u.ref->item_type == MIR_proto_item"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x848,
                        "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
        }
        ppMVar10 = (MIR_proto_t *)((long)&pMVar2->ops[0].u + 0x10);
        uVar13 = 2;
LAB_00132b3b:
        pMVar4 = *ppMVar10;
        uVar8 = 0;
        if (uVar13 <= nop) {
          uVar8 = (uint)(nop < pMVar4->nres + uVar13);
        }
        *out_p = uVar8;
        varr = pMVar4->args;
        uVar15 = pMVar4->nres + uVar13;
        if (varr == (VARR_MIR_var_t *)0x0) {
          sVar11 = 0;
        }
        else {
          sVar11 = varr->els_num;
        }
        uVar12 = sVar11 + uVar15;
        if ((pMVar4->vararg_p != '\0') && (uVar12 <= nop)) {
          return MIR_OP_UNDEF;
        }
        if ((uVar14 < uVar12) || ((pMVar4->vararg_p == '\0' && (uVar14 != uVar12)))) {
          __assert_fail("nops >= nargs && (proto->vararg_p || nops == nargs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x84f,
                        "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
        }
        if (nop == 0) {
          return (uint)(byte)insn->ops[0].field_0x8;
        }
        if (nop == 1 && iVar9 != 0xb5) {
          return MIR_OP_INT;
        }
        if ((nop < uVar13) || (uVar15 <= nop)) {
          VARR_MIR_var_tget(&local_28,varr,nop - uVar15);
        }
        else {
          local_28.type = pMVar4->res_types[nop - uVar13];
        }
        if (local_28.type == MIR_T_F) {
          return MIR_OP_FLOAT;
        }
        if (local_28.type == MIR_T_D) {
          return MIR_OP_DOUBLE;
        }
        if (local_28.type == MIR_T_UNDEF) {
          return MIR_OP_UNDEF;
        }
        return (uint)(local_28.type == MIR_T_LD) * 4 + MIR_OP_INT;
      }
LAB_00132bcf:
      bVar1 = *(byte *)(nop + (uVar13 & 0xffffffff) * 0x18 + 0x1e2b40);
      if (-1 < (char)bVar1) {
        return (uint)bVar1;
      }
      *out_p = 1;
      return bVar1 & 0x7f;
    }
    *out_p = (uint)(nop == 0);
    if (nop == 0) {
      return MIR_OP_INT;
    }
LAB_00132ae2:
    return (uint)(byte)insn->ops[nop].field_0x8;
  }
  if (0xb8 < iVar9) {
    if (iVar9 != 0xb9) {
      if (iVar9 != 0xba) goto LAB_00132bcf;
      *out_p = (uint)(nop == 0);
    }
    goto LAB_00132ae2;
  }
  if (iVar9 - 0xaaU < 2) {
    if (nop == 0 && iVar9 != 0xab) {
      return MIR_OP_INT;
    }
    goto LAB_00132ae2;
  }
  if (iVar9 != 0xb5) goto LAB_00132bcf;
  if (insn->ops[0].field_0x8 != '\x03') {
    __assert_fail("insn->ops[0].mode == MIR_OP_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x842,"MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)")
    ;
  }
  pVVar3 = ctx->unspec_protos;
  if (pVVar3 == (VARR_MIR_proto_t *)0x0) {
    MIR_insn_op_mode_cold_2();
LAB_00132ca8:
    __assert_fail("insn->ops[0].u.u < (VARR_MIR_proto_tlength (ctx->unspec_protos))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x843,"MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)")
    ;
  }
  uVar13 = insn->ops[0].u.u;
  if (pVVar3->els_num <= uVar13) goto LAB_00132ca8;
  ppMVar10 = pVVar3->varr;
  if (ppMVar10 != (MIR_proto_t *)0x0) {
    ppMVar10 = ppMVar10 + uVar13;
    uVar13 = 1;
    goto LAB_00132b3b;
  }
  MIR_insn_op_mode_cold_1();
  plVar5 = (long *)extraout_RDX[0xf];
  puVar6 = (ulong *)*plVar5;
  if (puVar6 == (ulong *)0x0) {
LAB_00132db6:
    find_rd_by_reg_cold_3();
  }
  else {
    __ptr = (void *)puVar6[2];
    if (__ptr != (void *)0x0) {
      sVar11 = *puVar6;
      unaff_RBP = (ulong)insn & 0xffffffff;
      uVar13 = sVar11 + 1;
      uVar14 = sVar11;
      if (puVar6[1] < uVar13) {
        uVar13 = (uVar13 >> 1) + uVar13;
        __ptr = realloc(__ptr,uVar13 * 0x18);
        puVar6[2] = (ulong)__ptr;
        puVar6[1] = uVar13;
        uVar13 = *puVar6 + 1;
        uVar14 = *puVar6;
      }
      *puVar6 = uVar13;
      *(undefined4 *)((long)__ptr + uVar14 * 0x18) = 6;
      *(int *)((long)__ptr + uVar14 * 0x18 + 4) = (int)insn;
      *(undefined8 *)((long)__ptr + uVar14 * 0x18 + 8) = 0;
      iVar9 = HTAB_size_t_do((HTAB_size_t *)plVar5[3],sVar11,HTAB_FIND,(size_t *)aiStack_78);
      insn = (MIR_insn_t_conflict)*plVar5;
      unaff_R14 = extraout_RDX;
      ppMStack_80 = ppMVar10;
      if (iVar9 == 0) goto LAB_00132dc0;
      if (((insn != (MIR_insn_t_conflict)0x0) &&
          (pMVar7 = (insn->insn_link).next, pMVar7 != (MIR_insn_t)0x0)) &&
         (insn->data != (void *)0x0)) {
        insn->data = (void *)((long)insn->data + -1);
        return (int)pMVar7 + aiStack_78[0] * 0x18;
      }
      find_rd_by_reg_cold_1();
      goto LAB_00132db6;
    }
  }
  find_rd_by_reg_cold_2();
LAB_00132dc0:
  VARR_reg_desc_tpop(&rStack_70,(VARR_reg_desc_t *)insn);
  uVar13 = 0xf;
  (*(code *)ppMStack_80[2])(0xf,"undeclared reg %u of func %s",unaff_RBP & 0xffffffff,*unaff_R14);
  if ((uint)uVar13 < 0xe) {
    return *(int *)(&DAT_001acb50 + (uVar13 & 0xffffffff) * 4) + 0x1acb50;
  }
  return 0x1ae6e3;
}

Assistant:

MIR_op_mode_t MIR_insn_op_mode (MIR_context_t ctx, MIR_insn_t insn, size_t nop, int *out_p) {
  MIR_insn_code_t code = insn->code;
  size_t nargs, nops = MIR_insn_nops (ctx, insn);
  unsigned mode;

  *out_p = FALSE; /* to remove unitialized warning */
  if (nop >= nops) return MIR_OP_BOUND;
  mir_assert (out_p != NULL);
  switch (code) {
  case MIR_RET:
  case MIR_SWITCH:
    /* should be already checked in MIR_finish_func */
    return nop == 0 && code != MIR_RET ? MIR_OP_INT : insn->ops[nop].mode;
  case MIR_ADDR:
  case MIR_ADDR8:
  case MIR_ADDR16:
  case MIR_ADDR32: *out_p = nop == 0; return nop == 0 ? MIR_OP_INT : insn->ops[nop].mode;
  case MIR_PHI: *out_p = nop == 0; return insn->ops[nop].mode;
  case MIR_USE: return insn->ops[nop].mode;
  case MIR_CALL:
  case MIR_INLINE:
  case MIR_UNSPEC: {
    MIR_op_t proto_op;
    MIR_proto_t proto;
    size_t args_start;

    if (code == MIR_UNSPEC) {
      args_start = 1;
      mir_assert (insn->ops[0].mode == MIR_OP_INT);
      mir_assert (insn->ops[0].u.u < VARR_LENGTH (MIR_proto_t, unspec_protos));
      proto = VARR_GET (MIR_proto_t, unspec_protos, insn->ops[0].u.u);
    } else {
      args_start = 2;
      proto_op = insn->ops[0];
      mir_assert (proto_op.mode == MIR_OP_REF && proto_op.u.ref->item_type == MIR_proto_item);
      proto = proto_op.u.ref->u.proto;
    }
    *out_p = args_start <= nop && nop < proto->nres + args_start;
    nargs
      = proto->nres + args_start + (proto->args == NULL ? 0 : VARR_LENGTH (MIR_var_t, proto->args));
    if (proto->vararg_p && nop >= nargs) return MIR_OP_UNDEF; /* unknown */
    mir_assert (nops >= nargs && (proto->vararg_p || nops == nargs));
    if (nop == 0) return insn->ops[nop].mode;
    if (nop == 1 && code != MIR_UNSPEC) return MIR_OP_INT; /* call func addr */
    if (args_start <= nop && nop < proto->nres + args_start)
      return type2mode (proto->res_types[nop - args_start]);
    return type2mode (VARR_GET (MIR_var_t, proto->args, nop - args_start - proto->nres).type);
  }
  default:
    mode = insn_descs[code].op_modes[nop];
    if ((mode & OUT_FLAG) == 0) return mode;
    *out_p = TRUE;
    return mode ^ OUT_FLAG;
  }
}